

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O0

REF_STATUS ref_recon_ghost_cloud(REF_CLOUD *one_layer,REF_NODE ref_node)

{
  int iVar1;
  uint uVar2;
  REF_GLOB local_128;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i_5;
  REF_INT ref_malloc_init_i_4;
  REF_INT ref_malloc_init_i_3;
  REF_INT ref_malloc_init_i_2;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_INT naux;
  REF_INT nkeyval;
  REF_GLOB global;
  REF_INT aux_index;
  REF_INT key_index;
  REF_INT cloud;
  REF_INT local;
  REF_INT *b_next;
  REF_INT *a_next;
  int local_a8;
  REF_INT degree;
  REF_INT node;
  REF_INT part;
  REF_DBL *b_aux;
  REF_DBL *a_aux;
  REF_GLOB *b_keyval;
  REF_GLOB *a_keyval;
  REF_INT b_ncloud_total;
  REF_INT a_ncloud_total;
  REF_INT *b_ncloud;
  REF_INT *a_ncloud;
  REF_INT *b_part;
  REF_INT *a_part;
  REF_GLOB *b_global;
  REF_GLOB *a_global;
  REF_INT b_nnode_total;
  REF_INT a_nnode_total;
  REF_INT *b_nnode;
  REF_INT *a_nnode;
  REF_CLOUD ref_cloud;
  REF_MPI ref_mpi;
  REF_NODE ref_node_local;
  REF_CLOUD *one_layer_local;
  
  ref_cloud = (REF_CLOUD)ref_node->ref_mpi;
  if (((REF_MPI)ref_cloud)->n < 2) {
    one_layer_local._4_4_ = 0;
  }
  else {
    ref_mpi = (REF_MPI)ref_node;
    ref_node_local = (REF_NODE)one_layer;
    if (((REF_MPI)ref_cloud)->n < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x321
             ,"ref_recon_ghost_cloud","malloc a_next of REF_INT negative");
      one_layer_local._4_4_ = 1;
    }
    else {
      b_next = (REF_INT *)malloc((long)((REF_MPI)ref_cloud)->n << 2);
      if (b_next == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x321,"ref_recon_ghost_cloud","malloc a_next of REF_INT NULL");
        one_layer_local._4_4_ = 2;
      }
      else {
        for (ref_malloc_init_i_2 = 0; ref_malloc_init_i_2 < ref_cloud->n;
            ref_malloc_init_i_2 = ref_malloc_init_i_2 + 1) {
          b_next[ref_malloc_init_i_2] = 0;
        }
        if (ref_cloud->n < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x322,"ref_recon_ghost_cloud","malloc b_next of REF_INT negative");
          one_layer_local._4_4_ = 1;
        }
        else {
          _cloud = (undefined4 *)malloc((long)ref_cloud->n << 2);
          if (_cloud == (undefined4 *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x322,"ref_recon_ghost_cloud","malloc b_next of REF_INT NULL");
            one_layer_local._4_4_ = 2;
          }
          else {
            for (ref_malloc_init_i_3 = 0; ref_malloc_init_i_3 < ref_cloud->n;
                ref_malloc_init_i_3 = ref_malloc_init_i_3 + 1) {
              _cloud[ref_malloc_init_i_3] = 0;
            }
            if (ref_cloud->n < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x323,"ref_recon_ghost_cloud","malloc a_nnode of REF_INT negative");
              one_layer_local._4_4_ = 1;
            }
            else {
              b_nnode = (REF_INT *)malloc((long)ref_cloud->n << 2);
              if (b_nnode == (REF_INT *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x323,"ref_recon_ghost_cloud","malloc a_nnode of REF_INT NULL");
                one_layer_local._4_4_ = 2;
              }
              else {
                for (ref_malloc_init_i_4 = 0; ref_malloc_init_i_4 < ref_cloud->n;
                    ref_malloc_init_i_4 = ref_malloc_init_i_4 + 1) {
                  b_nnode[ref_malloc_init_i_4] = 0;
                }
                if (ref_cloud->n < 0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x324,"ref_recon_ghost_cloud","malloc b_nnode of REF_INT negative");
                  one_layer_local._4_4_ = 1;
                }
                else {
                  _b_nnode_total = (REF_INT *)malloc((long)ref_cloud->n << 2);
                  if (_b_nnode_total == (REF_INT *)0x0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                           ,0x324,"ref_recon_ghost_cloud","malloc b_nnode of REF_INT NULL");
                    one_layer_local._4_4_ = 2;
                  }
                  else {
                    for (ref_malloc_init_i_5 = 0; ref_malloc_init_i_5 < ref_cloud->n;
                        ref_malloc_init_i_5 = ref_malloc_init_i_5 + 1) {
                      _b_nnode_total[ref_malloc_init_i_5] = 0;
                    }
                    if (ref_cloud->n < 0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                             ,0x325,"ref_recon_ghost_cloud","malloc a_ncloud of REF_INT negative");
                      one_layer_local._4_4_ = 1;
                    }
                    else {
                      b_ncloud = (REF_INT *)malloc((long)ref_cloud->n << 2);
                      if (b_ncloud == (REF_INT *)0x0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                               ,0x325,"ref_recon_ghost_cloud","malloc a_ncloud of REF_INT NULL");
                        one_layer_local._4_4_ = 2;
                      }
                      else {
                        for (ref_private_macro_code_rss = 0;
                            ref_private_macro_code_rss < ref_cloud->n;
                            ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                          b_ncloud[ref_private_macro_code_rss] = 0;
                        }
                        if (ref_cloud->n < 0) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                 ,0x326,"ref_recon_ghost_cloud",
                                 "malloc b_ncloud of REF_INT negative");
                          one_layer_local._4_4_ = 1;
                        }
                        else {
                          _b_ncloud_total = (REF_INT *)malloc((long)ref_cloud->n << 2);
                          if (_b_ncloud_total == (REF_INT *)0x0) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                   ,0x326,"ref_recon_ghost_cloud","malloc b_ncloud of REF_INT NULL")
                            ;
                            one_layer_local._4_4_ = 2;
                          }
                          else {
                            for (ref_private_macro_code_rss_1 = 0;
                                ref_private_macro_code_rss_1 < ref_cloud->n;
                                ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                              _b_ncloud_total[ref_private_macro_code_rss_1] = 0;
                            }
                            for (local_a8 = 0; local_a8 < ref_mpi->id; local_a8 = local_a8 + 1) {
                              if ((((-1 < local_a8) && (local_a8 < ref_mpi->id)) &&
                                  (-1 < *(long *)((long)ref_mpi->comm + (long)local_a8 * 8))) &&
                                 (ref_cloud->max !=
                                  *(int *)(*(long *)&ref_mpi->native_alltoallv + (long)local_a8 * 4)
                                 )) {
                                iVar1 = *(int *)(*(long *)&ref_mpi->native_alltoallv +
                                                (long)local_a8 * 4);
                                b_nnode[iVar1] = b_nnode[iVar1] + 1;
                              }
                            }
                            uVar2 = ref_mpi_alltoall((REF_MPI)ref_cloud,b_nnode,_b_nnode_total,1);
                            if (uVar2 == 0) {
                              a_global._4_4_ = 0;
                              for (degree = 0; degree < ref_cloud->n; degree = degree + 1) {
                                a_global._4_4_ = b_nnode[degree] + a_global._4_4_;
                              }
                              if (a_global._4_4_ < 0) {
                                printf("%s: %d: %s: %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                       ,0x334,"ref_recon_ghost_cloud",
                                       "malloc a_global of REF_GLOB negative");
                                one_layer_local._4_4_ = 1;
                              }
                              else {
                                b_global = (REF_GLOB *)malloc((long)a_global._4_4_ << 3);
                                if (b_global == (REF_GLOB *)0x0) {
                                  printf("%s: %d: %s: %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                         ,0x334,"ref_recon_ghost_cloud",
                                         "malloc a_global of REF_GLOB NULL");
                                  one_layer_local._4_4_ = 2;
                                }
                                else if (a_global._4_4_ < 0) {
                                  printf("%s: %d: %s: %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                         ,0x335,"ref_recon_ghost_cloud",
                                         "malloc a_part of REF_INT negative");
                                  one_layer_local._4_4_ = 1;
                                }
                                else {
                                  b_part = (REF_INT *)malloc((long)a_global._4_4_ << 2);
                                  if (b_part == (REF_INT *)0x0) {
                                    printf("%s: %d: %s: %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                           ,0x335,"ref_recon_ghost_cloud",
                                           "malloc a_part of REF_INT NULL");
                                    one_layer_local._4_4_ = 2;
                                  }
                                  else {
                                    a_global._0_4_ = 0;
                                    for (degree = 0; degree < ref_cloud->n; degree = degree + 1) {
                                      a_global._0_4_ = _b_nnode_total[degree] + (int)a_global;
                                    }
                                    if ((int)a_global < 0) {
                                      printf("%s: %d: %s: %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                             ,0x339,"ref_recon_ghost_cloud",
                                             "malloc b_global of REF_GLOB negative");
                                      one_layer_local._4_4_ = 1;
                                    }
                                    else {
                                      a_part = (REF_INT *)malloc((long)(int)a_global << 3);
                                      if (a_part == (REF_INT *)0x0) {
                                        printf("%s: %d: %s: %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                               ,0x339,"ref_recon_ghost_cloud",
                                               "malloc b_global of REF_GLOB NULL");
                                        one_layer_local._4_4_ = 2;
                                      }
                                      else if ((int)a_global < 0) {
                                        printf("%s: %d: %s: %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                               ,0x33a,"ref_recon_ghost_cloud",
                                               "malloc b_part of REF_INT negative");
                                        one_layer_local._4_4_ = 1;
                                      }
                                      else {
                                        a_ncloud = (REF_INT *)malloc((long)(int)a_global << 2);
                                        if (a_ncloud == (REF_INT *)0x0) {
                                          printf("%s: %d: %s: %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                                 ,0x33a,"ref_recon_ghost_cloud",
                                                 "malloc b_part of REF_INT NULL");
                                          one_layer_local._4_4_ = 2;
                                        }
                                        else {
                                          *b_next = 0;
                                          for (degree = 1; degree < ref_cloud->n;
                                              degree = degree + 1) {
                                            b_next[degree] =
                                                 b_next[degree + -1] + b_nnode[degree + -1];
                                          }
                                          for (local_a8 = 0; local_a8 < ref_mpi->id;
                                              local_a8 = local_a8 + 1) {
                                            if (((-1 < local_a8) && (local_a8 < ref_mpi->id)) &&
                                               ((-1 < *(long *)((long)ref_mpi->comm +
                                                               (long)local_a8 * 8) &&
                                                (ref_cloud->max !=
                                                 *(int *)(*(long *)&ref_mpi->native_alltoallv +
                                                         (long)local_a8 * 4))))) {
                                              degree = *(int *)(*(long *)&ref_mpi->native_alltoallv
                                                               + (long)local_a8 * 4);
                                              if (((local_a8 < 0) || (ref_mpi->id <= local_a8)) ||
                                                 (*(long *)((long)ref_mpi->comm + (long)local_a8 * 8
                                                           ) < 0)) {
                                                local_128 = -1;
                                              }
                                              else {
                                                local_128 = *(REF_GLOB *)
                                                             ((long)ref_mpi->comm +
                                                             (long)local_a8 * 8);
                                              }
                                              b_global[b_next[degree]] = local_128;
                                              b_part[b_next[degree]] = ref_cloud->max;
                                              iVar1 = *(int *)(*(long *)&ref_mpi->native_alltoallv +
                                                              (long)local_a8 * 4);
                                              b_next[iVar1] = b_next[iVar1] + 1;
                                            }
                                          }
                                          uVar2 = ref_mpi_alltoallv((REF_MPI)ref_cloud,b_global,
                                                                    b_nnode,a_part,_b_nnode_total,1,
                                                                    2);
                                          if (uVar2 == 0) {
                                            uVar2 = ref_mpi_alltoallv((REF_MPI)ref_cloud,b_part,
                                                                      b_nnode,a_ncloud,
                                                                      _b_nnode_total,1,1);
                                            if (uVar2 == 0) {
                                              for (local_a8 = 0; local_a8 < (int)a_global;
                                                  local_a8 = local_a8 + 1) {
                                                uVar2 = ::ref_node_local((REF_NODE)ref_mpi,
                                                                         *(REF_GLOB *)
                                                                          (a_part + (long)local_a8 *
                                                                                    2),&key_index);
                                                if (uVar2 != 0) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                                  ,0x353,"ref_recon_ghost_cloud",(ulong)uVar2,"g2l")
                                                  ;
                                                  return uVar2;
                                                }
                                                degree = a_ncloud[local_a8];
                                                a_next._4_4_ = **(int **)(&ref_node_local->n +
                                                                         (long)key_index * 2);
                                                _b_ncloud_total[degree] =
                                                     a_next._4_4_ + _b_ncloud_total[degree];
                                              }
                                              uVar2 = ref_mpi_alltoall((REF_MPI)ref_cloud,
                                                                       _b_ncloud_total,b_ncloud,1);
                                              if (uVar2 == 0) {
                                                a_keyval._4_4_ = 0;
                                                for (degree = 0; degree < ref_cloud->n;
                                                    degree = degree + 1) {
                                                  a_keyval._4_4_ = b_ncloud[degree] + a_keyval._4_4_
                                                  ;
                                                }
                                                if (a_keyval._4_4_ * 2 < 0) {
                                                  printf("%s: %d: %s: %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                                  ,0x35e,"ref_recon_ghost_cloud",
                                                  "malloc a_keyval of REF_GLOB negative");
                                                  one_layer_local._4_4_ = 1;
                                                }
                                                else {
                                                  b_keyval = (REF_GLOB *)
                                                             malloc((long)(a_keyval._4_4_ * 2) << 3)
                                                  ;
                                                  if (b_keyval == (REF_GLOB *)0x0) {
                                                    printf("%s: %d: %s: %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                                  ,0x35e,"ref_recon_ghost_cloud",
                                                  "malloc a_keyval of REF_GLOB NULL");
                                                  one_layer_local._4_4_ = 2;
                                                  }
                                                  else if (a_keyval._4_4_ * 4 < 0) {
                                                    printf("%s: %d: %s: %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                                  ,0x35f,"ref_recon_ghost_cloud",
                                                  "malloc a_aux of REF_DBL negative");
                                                  one_layer_local._4_4_ = 1;
                                                  }
                                                  else {
                                                    b_aux = (REF_DBL *)
                                                            malloc((long)(a_keyval._4_4_ * 4) << 3);
                                                    if (b_aux == (REF_DBL *)0x0) {
                                                      printf("%s: %d: %s: %s\n",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                                  ,0x35f,"ref_recon_ghost_cloud",
                                                  "malloc a_aux of REF_DBL NULL");
                                                  one_layer_local._4_4_ = 2;
                                                  }
                                                  else {
                                                    a_keyval._0_4_ = 0;
                                                    for (degree = 0; degree < ref_cloud->n;
                                                        degree = degree + 1) {
                                                      a_keyval._0_4_ =
                                                           _b_ncloud_total[degree] + (int)a_keyval;
                                                    }
                                                    if ((int)a_keyval * 2 < 0) {
                                                      printf("%s: %d: %s: %s\n",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                                  ,0x363,"ref_recon_ghost_cloud",
                                                  "malloc b_keyval of REF_GLOB negative");
                                                  one_layer_local._4_4_ = 1;
                                                  }
                                                  else {
                                                    a_aux = (REF_DBL *)
                                                            malloc((long)((int)a_keyval * 2) << 3);
                                                    if (a_aux == (REF_DBL *)0x0) {
                                                      printf("%s: %d: %s: %s\n",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                                  ,0x363,"ref_recon_ghost_cloud",
                                                  "malloc b_keyval of REF_GLOB NULL");
                                                  one_layer_local._4_4_ = 2;
                                                  }
                                                  else if ((int)a_keyval * 4 < 0) {
                                                    printf("%s: %d: %s: %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                                  ,0x364,"ref_recon_ghost_cloud",
                                                  "malloc b_aux of REF_DBL negative");
                                                  one_layer_local._4_4_ = 1;
                                                  }
                                                  else {
                                                    _node = malloc((long)((int)a_keyval * 4) << 3);
                                                    if (_node == (void *)0x0) {
                                                      printf("%s: %d: %s: %s\n",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                                  ,0x364,"ref_recon_ghost_cloud",
                                                  "malloc b_aux of REF_DBL NULL");
                                                  one_layer_local._4_4_ = 2;
                                                  }
                                                  else {
                                                    *_cloud = 0;
                                                    for (degree = 1; degree < ref_cloud->n;
                                                        degree = degree + 1) {
                                                      _cloud[degree] =
                                                           _cloud[degree + -1] +
                                                           _b_ncloud_total[degree + -1];
                                                    }
                                                    for (local_a8 = 0; local_a8 < (int)a_global;
                                                        local_a8 = local_a8 + 1) {
                                                      uVar2 = ::ref_node_local((REF_NODE)ref_mpi,
                                                                               *(REF_GLOB *)
                                                                                (a_part + (long)
                                                  local_a8 * 2),&key_index);
                                                  if (uVar2 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                                  ,0x36c,"ref_recon_ghost_cloud",(ulong)uVar2,"g2l")
                                                  ;
                                                  return uVar2;
                                                  }
                                                  degree = a_ncloud[local_a8];
                                                  a_nnode = *(REF_INT **)
                                                             (&ref_node_local->n +
                                                             (long)key_index * 2);
                                                  for (global._4_4_ = 0; global._4_4_ < *a_nnode;
                                                      global._4_4_ = global._4_4_ + 1) {
                                                    a_aux[_cloud[degree] * 2] =
                                                         *(REF_DBL *)(a_part + (long)local_a8 * 2);
                                                    a_aux[_cloud[degree] * 2 + 1] =
                                                         *(REF_DBL *)
                                                          (*(long *)(a_nnode + 4) +
                                                          (long)global._4_4_ * 8);
                                                    for (global._0_4_ = 0; (int)global < 4;
                                                        global._0_4_ = (int)global + 1) {
                                                      *(undefined8 *)
                                                       ((long)_node +
                                                       (long)((int)global + _cloud[degree] * 4) * 8)
                                                           = *(undefined8 *)
                                                              (*(long *)(a_nnode + 6) +
                                                              (long)((int)global +
                                                                    a_nnode[2] * global._4_4_) * 8);
                                                    }
                                                    _cloud[degree] = _cloud[degree] + 1;
                                                  }
                                                  }
                                                  uVar2 = ref_mpi_alltoallv((REF_MPI)ref_cloud,a_aux
                                                                            ,_b_ncloud_total,
                                                                            b_keyval,b_ncloud,2,2);
                                                  if (uVar2 == 0) {
                                                    uVar2 = ref_mpi_alltoallv((REF_MPI)ref_cloud,
                                                                              _node,_b_ncloud_total,
                                                                              b_aux,b_ncloud,4,3);
                                                    if (uVar2 == 0) {
                                                      for (aux_index = 0; aux_index < a_keyval._4_4_
                                                          ; aux_index = aux_index + 1) {
                                                        uVar2 = ::ref_node_local((REF_NODE)ref_mpi,
                                                                                 b_keyval[aux_index 
                                                  * 2],&key_index);
                                                  if (uVar2 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                                  ,900,"ref_recon_ghost_cloud",(ulong)uVar2,"g2l");
                                                  return uVar2;
                                                  }
                                                  a_nnode = *(REF_INT **)
                                                             (&ref_node_local->n +
                                                             (long)key_index * 2);
                                                  uVar2 = ref_cloud_store((REF_CLOUD)a_nnode,
                                                                          b_keyval[aux_index * 2 + 1
                                                                                  ],
                                                                          b_aux + aux_index * 4);
                                                  if (uVar2 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                                  ,0x388,"ref_recon_ghost_cloud",(ulong)uVar2,
                                                  "add ghost");
                                                  return uVar2;
                                                  }
                                                  }
                                                  free(_node);
                                                  free(a_aux);
                                                  free(b_aux);
                                                  free(b_keyval);
                                                  free(a_ncloud);
                                                  free(a_part);
                                                  free(b_part);
                                                  free(b_global);
                                                  free(_b_ncloud_total);
                                                  free(b_ncloud);
                                                  free(_b_nnode_total);
                                                  free(b_nnode);
                                                  free(_cloud);
                                                  free(b_next);
                                                  one_layer_local._4_4_ = 0;
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                                  ,0x380,"ref_recon_ghost_cloud",(ulong)uVar2,
                                                  "alltoallv aux");
                                                  one_layer_local._4_4_ = uVar2;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                                  ,0x37d,"ref_recon_ghost_cloud",(ulong)uVar2,
                                                  "alltoallv keyval");
                                                  one_layer_local._4_4_ = uVar2;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                              else {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                                  ,0x35a,"ref_recon_ghost_cloud",(ulong)uVar2,
                                                  "alltoall nclouds");
                                                one_layer_local._4_4_ = uVar2;
                                              }
                                            }
                                            else {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                                  ,0x34f,"ref_recon_ghost_cloud",(ulong)uVar2,
                                                  "alltoallv part");
                                              one_layer_local._4_4_ = uVar2;
                                            }
                                          }
                                          else {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                                  ,0x34c,"ref_recon_ghost_cloud",(ulong)uVar2,
                                                  "alltoallv global");
                                            one_layer_local._4_4_ = uVar2;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                     ,0x330,"ref_recon_ghost_cloud",(ulong)uVar2,"alltoall nnodes");
                              one_layer_local._4_4_ = uVar2;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return one_layer_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_recon_ghost_cloud(REF_CLOUD *one_layer,
                                         REF_NODE ref_node) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_CLOUD ref_cloud;
  REF_INT *a_nnode, *b_nnode;
  REF_INT a_nnode_total, b_nnode_total;
  REF_GLOB *a_global, *b_global;
  REF_INT *a_part, *b_part;
  REF_INT *a_ncloud, *b_ncloud;
  REF_INT a_ncloud_total, b_ncloud_total;
  REF_GLOB *a_keyval, *b_keyval;
  REF_DBL *a_aux, *b_aux;
  REF_INT part, node, degree;
  REF_INT *a_next, *b_next;
  REF_INT local, cloud, key_index, aux_index;
  REF_GLOB global;
  REF_INT nkeyval = 2, naux = 4;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_next, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_next, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(a_nnode, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_nnode, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(a_ncloud, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_ncloud, ref_mpi_n(ref_mpi), REF_INT, 0);

  /* ghost nodes need to fill */
  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) {
      a_nnode[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_nnode, b_nnode, REF_INT_TYPE),
      "alltoall nnodes");

  a_nnode_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_nnode_total += a_nnode[part];
  ref_malloc(a_global, a_nnode_total, REF_GLOB);
  ref_malloc(a_part, a_nnode_total, REF_INT);

  b_nnode_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_nnode_total += b_nnode[part];
  ref_malloc(b_global, b_nnode_total, REF_GLOB);
  ref_malloc(b_part, b_nnode_total, REF_INT);

  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    a_next[part] = a_next[part - 1] + a_nnode[part - 1];
  }

  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) {
      part = ref_node_part(ref_node, node);
      a_global[a_next[part]] = ref_node_global(ref_node, node);
      a_part[a_next[part]] = ref_mpi_rank(ref_mpi);
      a_next[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_global, a_nnode, b_global, b_nnode, 1,
                        REF_GLOB_TYPE),
      "alltoallv global");
  RSS(ref_mpi_alltoallv(ref_mpi, a_part, a_nnode, b_part, b_nnode, 1,
                        REF_INT_TYPE),
      "alltoallv part");

  /* degree of these node cloud to send */
  for (node = 0; node < b_nnode_total; node++) {
    RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
    part = b_part[node];
    degree = ref_cloud_n(one_layer[local]);
    b_ncloud[part] += degree;
  }

  RSS(ref_mpi_alltoall(ref_mpi, b_ncloud, a_ncloud, REF_INT_TYPE),
      "alltoall nclouds");

  a_ncloud_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_ncloud_total += a_ncloud[part];
  ref_malloc(a_keyval, nkeyval * a_ncloud_total, REF_GLOB);
  ref_malloc(a_aux, naux * a_ncloud_total, REF_DBL);

  b_ncloud_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_ncloud_total += b_ncloud[part];
  ref_malloc(b_keyval, nkeyval * b_ncloud_total, REF_GLOB);
  ref_malloc(b_aux, naux * b_ncloud_total, REF_DBL);

  b_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    b_next[part] = b_next[part - 1] + b_ncloud[part - 1];
  }

  for (node = 0; node < b_nnode_total; node++) {
    RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
    part = b_part[node];
    ref_cloud = one_layer[local];
    each_ref_cloud_item(ref_cloud, key_index) {
      b_keyval[0 + nkeyval * b_next[part]] = b_global[node];
      b_keyval[1 + nkeyval * b_next[part]] =
          ref_cloud_global(ref_cloud, key_index);
      for (aux_index = 0; aux_index < naux; aux_index++) {
        b_aux[aux_index + naux * b_next[part]] =
            ref_cloud_aux(ref_cloud, aux_index, key_index);
      }
      b_next[part]++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, b_keyval, b_ncloud, a_keyval, a_ncloud,
                        nkeyval, REF_GLOB_TYPE),
      "alltoallv keyval");
  RSS(ref_mpi_alltoallv(ref_mpi, b_aux, b_ncloud, a_aux, a_ncloud, naux,
                        REF_DBL_TYPE),
      "alltoallv aux");

  for (cloud = 0; cloud < a_ncloud_total; cloud++) {
    global = a_keyval[0 + nkeyval * cloud];
    RSS(ref_node_local(ref_node, global, &local), "g2l");
    ref_cloud = one_layer[local];
    RSS(ref_cloud_store(ref_cloud, a_keyval[1 + nkeyval * cloud],
                        &(a_aux[naux * cloud])),
        "add ghost");
  }

  free(b_aux);
  free(b_keyval);
  free(a_aux);
  free(a_keyval);
  free(b_part);
  free(b_global);
  free(a_part);
  free(a_global);
  free(b_ncloud);
  free(a_ncloud);
  free(b_nnode);
  free(a_nnode);
  free(b_next);
  free(a_next);

  return REF_SUCCESS;
}